

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

void __thiscall Func::AddFrameDisplayCheck(Func *this,SymOpnd *fieldOpnd,uint32 slotId)

{
  uint value;
  Sym *pSVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  undefined4 *puVar4;
  HashTable<FrameDisplayCheckRecord_*,_Memory::JitArenaAllocator> *pHVar5;
  FrameDisplayCheckRecord **ppFVar6;
  FrameDisplayCheckRecord *pFVar7;
  HashTable<unsigned_int,_Memory::JitArenaAllocator> *pHVar8;
  uint *puVar9;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,ClosureRangeCheckPhase,sourceContextId,functionId);
  if (!bVar3) {
    if (this->parentFunc != (Func *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x411,"(IsTopFunc())","IsTopFunc()");
      if (!bVar3) goto LAB_0042e0e3;
      *puVar4 = 0;
    }
    if (this->frameDisplayCheckTable == (FrameDisplayCheckTable *)0x0) {
      pHVar5 = HashTable<FrameDisplayCheckRecord_*,_Memory::JitArenaAllocator>::New(this->m_alloc,4)
      ;
      this->frameDisplayCheckTable = pHVar5;
    }
    pSVar1 = fieldOpnd->m_sym;
    if (pSVar1->m_kind != SymKindProperty) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
      if (!bVar3) {
LAB_0042e0e3:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    ppFVar6 = HashTable<FrameDisplayCheckRecord_*,_Memory::JitArenaAllocator>::FindOrInsertNew
                        (this->frameDisplayCheckTable,(pSVar1[1].m_next)->m_id);
    if (*ppFVar6 == (FrameDisplayCheckRecord *)0x0) {
      pFVar7 = (FrameDisplayCheckRecord *)
               new<Memory::JitArenaAllocator>(0x10,this->m_alloc,0x3f1274);
      pFVar7->table = (SlotArrayCheckTable *)0x0;
      pFVar7->slotId = 0xffffffff;
      *ppFVar6 = pFVar7;
    }
    value = *(uint *)&pSVar1[1]._vptr_Sym;
    pFVar7 = *ppFVar6;
    if ((pFVar7->table == (SlotArrayCheckTable *)0x0) || (pFVar7->slotId < value)) {
      pFVar7->slotId = value;
    }
    if (slotId != 0xffffffff) {
      if (pFVar7->table == (SlotArrayCheckTable *)0x0) {
        pHVar8 = HashTable<unsigned_int,_Memory::JitArenaAllocator>::New(this->m_alloc,4);
        (*ppFVar6)->table = pHVar8;
      }
      puVar9 = HashTable<unsigned_int,_Memory::JitArenaAllocator>::FindOrInsert
                         ((*ppFVar6)->table,slotId,value);
      if ((puVar9 != (uint *)0x0) && (*puVar9 < slotId)) {
        *puVar9 = slotId;
      }
    }
  }
  return;
}

Assistant:

void Func::AddFrameDisplayCheck(IR::SymOpnd *fieldOpnd, uint32 slotId)
{
    if (PHASE_OFF(Js::ClosureRangeCheckPhase, this))
    {
        return;
    }

    Assert(IsTopFunc());
    if (this->frameDisplayCheckTable == nullptr)
    {
        this->frameDisplayCheckTable = FrameDisplayCheckTable::New(m_alloc, 4);
    }

    PropertySym *propertySym = fieldOpnd->m_sym->AsPropertySym();
    FrameDisplayCheckRecord **record = this->frameDisplayCheckTable->FindOrInsertNew(propertySym->m_stackSym->m_id);
    if (*record == nullptr)
    {
        *record = JitAnew(m_alloc, FrameDisplayCheckRecord);
    }

    uint32 frameDisplaySlot = propertySym->m_propertyId;
    if ((*record)->table == nullptr || (*record)->slotId < frameDisplaySlot)
    {
        (*record)->slotId = frameDisplaySlot;
    }

    if (slotId != (uint32)-1)
    {
        if ((*record)->table == nullptr)
        {
            (*record)->table = SlotArrayCheckTable::New(m_alloc, 4);
        }
        uint32 *pSlotId = (*record)->table->FindOrInsert(slotId, frameDisplaySlot);
        if (pSlotId && *pSlotId < slotId)
        {
            *pSlotId = slotId;
        }
    }
}